

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorFinder.hpp
# Opt level: O1

void __thiscall
peach::fsm::OperatorFinder::OperatorFinder
          (OperatorFinder *this,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *operators)

{
  pointer ppVar1;
  pointer pattern;
  
  FiniteStateMachine::FiniteStateMachine(&this->super_FiniteStateMachine);
  ppVar1 = (operators->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pattern = (operators->
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pattern != ppVar1;
      pattern = pattern + 1) {
    addOperatorPattern(this,&pattern->first,pattern->second);
  }
  return;
}

Assistant:

OperatorFinder(const std::vector<std::pair<std::string, token::tokenCategory_t>> &operators)
    {
        std::for_each(operators.begin(), operators.end(), [&](const auto &pat) {
            addOperatorPattern(pat.first, pat.second);
        });
    }